

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O3

int dowhatisinv(obj *obj)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  char *pcVar5;
  objclass *poVar6;
  long lVar7;
  char *inp;
  bool bVar8;
  boolean without_asking;
  ulong uVar9;
  byte *pbVar10;
  byte bVar11;
  
  if (obj == (obj *)0x0) {
    obj = getobj("\x14","examine",(obj **)0x0);
  }
  poVar6 = objects;
  bVar8 = obj == &zeroobj || obj == (obj *)0x0;
  uVar9 = (ulong)bVar8;
  if (bVar8) {
    return 0;
  }
  uVar1 = obj->onamelth;
  if ((uVar1 != '\0') && ((obj->field_0x4a & 0x30) != 0)) {
    lVar7 = (long)obj->oxlth;
    bVar2 = *(byte *)((long)obj->oextra + lVar7);
    uVar9 = (ulong)bVar2;
    bVar11 = bVar2 + 0xbf;
    if (bVar11 < 0x1a) {
      pbVar10 = (byte *)((long)obj->oextra + lVar7 + 1);
      do {
        if ((0x19 < (byte)(((byte)uVar9 & 0xdf) + 0xbf)) &&
           ((0x2d < (byte)uVar9 || ((0x208100000000U >> (uVar9 & 0x3f) & 1) == 0))))
        goto LAB_0020f242;
        bVar3 = *pbVar10;
        uVar9 = (ulong)bVar3;
        pbVar10 = pbVar10 + 1;
      } while ((bVar11 < 0x1a || bVar2 == 0) && bVar3 != 0);
    }
    without_asking = (boolean)uVar9;
    if (bVar11 < 0x1a || bVar2 == 0) {
      inp = (char *)((long)obj->oextra + lVar7);
      goto LAB_0020f2fc;
    }
  }
LAB_0020f242:
  uVar4 = obj->otyp;
  if (uVar4 < 0x10f) {
    if ((uVar4 != 0xf6) && (uVar4 != 0x10e)) goto LAB_0020f2ab;
  }
  else if (uVar4 == 0x10f) {
    uVar9 = (ulong)obj->corpsenm;
    if ((long)uVar9 < 0) goto LAB_0020f2ab;
    if ((obj->field_0x4a & 0x10) == 0) {
      bVar2 = mvitals[uVar9].mvflags & 8;
      uVar9 = uVar9 * 3;
      goto joined_r0x0020f2a9;
    }
  }
  else if (uVar4 != 0x215) {
    if (((uVar4 == 0x129) && (obj->spe < '\x01')) && (-1 < obj->corpsenm)) {
      bVar2 = obj->field_0x4a & 0x10;
joined_r0x0020f2a9:
      if (bVar2 != 0) goto LAB_0020f2e5;
    }
LAB_0020f2ab:
    without_asking = -0x28;
    pcVar5 = objects[(short)uVar4].oc_uname;
    obj->onamelth = '\0';
    poVar6[(short)uVar4].oc_uname = (char *)0x0;
    inp = xname_single(obj);
    obj->onamelth = uVar1;
    poVar6[(short)uVar4].oc_uname = pcVar5;
    goto LAB_0020f2fc;
  }
LAB_0020f2e5:
  without_asking = (boolean)uVar9;
  inp = mons_mname(mons + obj->corpsenm);
LAB_0020f2fc:
  checkfile(inp,(permonst *)0x1,'\x01',without_asking);
  return 0;
}

Assistant:

int dowhatisinv(struct obj *obj)
{
	static const char allowall[] = { ALL_CLASSES, 0 };

	if (!obj)
	    obj = getobj(allowall, "examine", NULL);
	if (!obj || obj == &zeroobj)
	    return 0;

	/* Fake user_typed_name for feedback on failure to find an entry. */
	checkfile(database_oname(obj), NULL, TRUE, TRUE);

	return 0;
}